

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void findConstInWhere(WhereConst *pConst,Expr *pExpr)

{
  Expr *pExpr_00;
  Expr *pColumn;
  Walker local_58;
  
  if (pExpr != (Expr *)0x0) {
    while ((pExpr->flags & pConst->mExcludeOn) == 0) {
      if (pExpr->op != ',') {
        if (pExpr->op != '5') {
          return;
        }
        pExpr_00 = pExpr->pLeft;
        pColumn = pExpr->pRight;
        if (pColumn->op == 0xa7) {
          local_58.pParse = pConst->pParse;
          local_58.eCode = 1;
          local_58.xExprCallback = exprNodeIsConstant;
          local_58.xSelectCallback = sqlite3SelectWalkFail;
          if ((pExpr_00 == (Expr *)0x0) ||
             (sqlite3WalkExprNN(&local_58,pExpr_00), local_58.eCode != 0)) {
            constInsert(pConst,pColumn,pExpr_00,pExpr);
          }
        }
        if (pExpr_00->op != 0xa7) {
          return;
        }
        local_58.pParse = pConst->pParse;
        local_58.eCode = 1;
        local_58.xExprCallback = exprNodeIsConstant;
        local_58.xSelectCallback = sqlite3SelectWalkFail;
        sqlite3WalkExprNN(&local_58,pColumn);
        if (local_58.eCode == 0) {
          return;
        }
        constInsert(pConst,pExpr_00,pColumn,pExpr);
        return;
      }
      findConstInWhere(pConst,pExpr->pRight);
      pExpr = pExpr->pLeft;
      if (pExpr == (Expr *)0x0) {
        return;
      }
    }
  }
  return;
}

Assistant:

static void findConstInWhere(WhereConst *pConst, Expr *pExpr){
  Expr *pRight, *pLeft;
  if( NEVER(pExpr==0) ) return;
  if( ExprHasProperty(pExpr, pConst->mExcludeOn) ){
    testcase( ExprHasProperty(pExpr, EP_OuterON) );
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    return;
  }
  if( pExpr->op==TK_AND ){
    findConstInWhere(pConst, pExpr->pRight);
    findConstInWhere(pConst, pExpr->pLeft);
    return;
  }
  if( pExpr->op!=TK_EQ ) return;
  pRight = pExpr->pRight;
  pLeft = pExpr->pLeft;
  assert( pRight!=0 );
  assert( pLeft!=0 );
  if( pRight->op==TK_COLUMN && sqlite3ExprIsConstant(pConst->pParse, pLeft) ){
    constInsert(pConst,pRight,pLeft,pExpr);
  }
  if( pLeft->op==TK_COLUMN && sqlite3ExprIsConstant(pConst->pParse, pRight) ){
    constInsert(pConst,pLeft,pRight,pExpr);
  }
}